

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

int __thiscall units::detail::unit_data::unit_type_count(unit_data *this)

{
  unit_data *this_local;
  
  return (uint)(((int)*this << 0x1c) >> 0x1c != 0) + (uint)(((int)*this << 0x18) >> 0x1c != 0) +
         (uint)(((int)*this << 0x15) >> 0x1d != 0) + (uint)(((int)*this << 0x12) >> 0x1d != 0) +
         (uint)(((int)*this << 0x10) >> 0x1e != 0) + (uint)(((int)*this << 0xd) >> 0x1d != 0) +
         (uint)(((int)*this << 0xb) >> 0x1e != 0) + (uint)(((int)*this << 8) >> 0x1d != 0) +
         (uint)(((int)*this << 6) >> 0x1e != 0) + (uint)(((int)*this << 4) >> 0x1e != 0);
}

Assistant:

constexpr int unit_type_count() const
        {
            return ((meter_ != 0) ? 1 : 0) + ((second_ != 0) ? 1 : 0) +
                ((kilogram_ != 0) ? 1 : 0) + ((ampere_ != 0) ? 1 : 0) +
                ((candela_ != 0) ? 1 : 0) + ((kelvin_ != 0) ? 1 : 0) +
                ((mole_ != 0) ? 1 : 0) + ((radians_ != 0) ? 1 : 0) +
                ((currency_ != 0) ? 1 : 0) + ((count_ != 0) ? 1 : 0);
        }